

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.hh
# Opt level: O0

void __thiscall AddrSpace::~AddrSpace(AddrSpace *this)

{
  AddrSpace *this_local;
  
  ~AddrSpace(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~AddrSpace(void) {}